

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_scale.c
# Opt level: O3

int main(int argc,char **argv)

{
  double dVar1;
  bool bVar2;
  bool bVar3;
  char cVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  bool bVar14;
  bool bVar15;
  undefined8 uVar16;
  byte bVar17;
  undefined8 uVar18;
  char *pcVar19;
  undefined8 uVar20;
  undefined8 in_R8;
  undefined8 in_R9;
  long lVar21;
  bool bVar22;
  undefined4 uVar23;
  float fVar24;
  float fVar25;
  uint uVar26;
  undefined4 uVar27;
  ALLEGRO_EVENT event;
  double local_d8;
  undefined4 local_98;
  undefined4 local_88;
  int local_78 [8];
  int local_58;
  int local_54;
  
  cVar4 = al_install_system(0x5020700,atexit);
  if (cVar4 == '\0') {
    pcVar19 = "Could not init Allegro.\n";
  }
  else {
    al_install_keyboard();
    al_init_image_addon();
    log_printf("Press \'w\' to toggle wide mode.\n");
    log_printf("Press \'s\' to toggle memory source bitmap.\n");
    log_printf("Press space to toggle drawing to backbuffer or off-screen bitmap.\n");
    log_printf("Press \'t\' to toggle translucency.\n");
    log_printf("Press \'h\' to toggle horizontal flipping.\n");
    log_printf("Press \'v\' to toggle vertical flipping.\n");
    log_printf("Press \'c\' to toggle clipping.\n");
    log_printf("\n");
    lVar8 = al_create_display(0x280,0x1e0);
    if (lVar8 == 0) {
      pcVar19 = "Unable to set any graphic mode\n";
    }
    else {
      lVar9 = al_create_bitmap(0x280,0x1e0);
      if (lVar9 == 0) {
        pcVar19 = "Unable to create buffer\n\n";
      }
      else {
        lVar10 = al_load_bitmap("data/mysha.pcx");
        if (lVar10 != 0) {
          al_set_new_bitmap_flags(1);
          lVar11 = al_load_bitmap("data/mysha.pcx");
          if (lVar11 != 0) {
            iVar6 = al_get_bitmap_width(lVar10);
            iVar7 = al_get_bitmap_height(lVar10);
            uVar12 = al_create_event_queue();
            uVar13 = al_get_keyboard_event_source();
            al_register_event_source(uVar12,uVar13);
            local_d8 = 0.0;
            bVar3 = false;
            bVar14 = false;
            bVar17 = 0;
            bVar15 = false;
            bVar5 = false;
            bVar2 = false;
            do {
              cVar4 = al_get_next_event(uVar12,local_78);
              if ((cVar4 != '\0') && (local_78[0] == 0xb)) {
                if (local_58 == 0x3b) {
                  al_destroy_bitmap(lVar10);
                  al_destroy_bitmap(lVar11);
                  al_destroy_bitmap(lVar9);
                  return 0;
                }
                if (local_54 == 0x20) {
                  bVar2 = !bVar2;
                  pcVar19 = "Drawing to off-screen buffer\n";
                  if (bVar2) {
                    pcVar19 = "Drawing to display backbuffer\n";
                  }
                  log_printf(pcVar19);
                }
                bVar22 = local_54 == 0x77;
                if (local_54 == 0x73) {
                  pcVar19 = "Source is memory bitmap\n";
                  if (bVar3) {
                    pcVar19 = "Source is display bitmap\n";
                  }
                  log_printf(pcVar19);
                  bVar3 = (bool)(bVar3 ^ 1);
                }
                bVar5 = (bool)(bVar5 ^ bVar22);
                bVar15 = (bool)(bVar15 ^ local_54 == 0x74);
                bVar17 = bVar17 ^ local_54 == 0x68;
                if (local_54 == 0x76) {
                  bVar17 = bVar17 ^ 2;
                }
                bVar14 = (bool)(bVar14 ^ local_54 == 99);
              }
              if (bVar2) {
                al_set_target_backbuffer(lVar8);
              }
              else {
                al_set_target_bitmap(lVar9);
              }
              lVar21 = lVar10;
              if (bVar3) {
                lVar21 = lVar11;
              }
              uVar26 = 0x40000000;
              if (!bVar5) {
                uVar26 = 0x3ff00000;
              }
              al_set_blender(0,1,0);
              local_98 = 0x3f800000;
              local_88 = al_map_rgba_f(0x3f800000,0x3f800000,0x3f800000,0x3f800000);
              if (bVar2) {
                uVar23 = 0;
                uVar27 = 0x3f800000;
              }
              else {
                uVar27 = 0;
                uVar23 = 0x3f800000;
              }
              al_map_rgba_f(uVar23,0,uVar27,0x3f800000);
              al_clear_to_color();
              if (bVar15) {
                al_set_blender(0,2,3);
                local_98 = 0x3f800000;
                local_88 = al_map_rgba_f(0x3f800000,0x3f800000,0x3f800000,0x3f000000);
              }
              if (bVar14) {
                uVar20 = 0x32;
                uVar18 = 0x32;
                uVar16 = 0x21c;
                uVar13 = 0x17c;
              }
              else {
                uVar20 = 0;
                uVar18 = 0;
                uVar16 = 0x280;
                uVar13 = 0x1e0;
              }
              al_set_clipping_rectangle(uVar20,uVar18,uVar16,uVar13);
              dVar1 = cos(local_d8);
              fVar24 = (float)(dVar1 * (double)((ulong)uVar26 << 0x20) * 640.0 * 0.5);
              dVar1 = sin(local_d8);
              fVar25 = (float)(dVar1 * (double)((ulong)uVar26 << 0x20) * 480.0 * 0.5);
              al_draw_tinted_scaled_bitmap
                        (local_88,local_98,0,0,(float)iVar6,(float)iVar7,0x43a00000,0x43700000,
                         lVar21,bVar17);
              if (!bVar2) {
                al_set_target_backbuffer(lVar8);
                al_set_clipping_rectangle(0,0,0x280,0x1e0,in_R8,in_R9,fVar24,fVar25);
                al_set_blender(0,1,0);
                al_draw_bitmap(0,0,lVar9,0);
              }
              al_flip_display();
              al_rest(0x47ae147b);
              local_d8 = local_d8 + 0.01;
            } while( true );
          }
        }
        pcVar19 = "Unable to load image\n";
      }
    }
  }
  abort_example(pcVar19);
  iVar6 = __cxa_atexit();
  return iVar6;
}

Assistant:

int main(int argc, char **argv)
{
   const int display_w = 640;
   const int display_h = 480;

   ALLEGRO_DISPLAY *dpy;
   ALLEGRO_BITMAP *buf;
   ALLEGRO_BITMAP *bmp;
   ALLEGRO_BITMAP *mem_bmp;
   ALLEGRO_BITMAP *src_bmp;
   int bmp_w;
   int bmp_h;
   ALLEGRO_EVENT_QUEUE *queue;
   ALLEGRO_EVENT event;
   double theta = 0;
   double k = 1.0;
   int mode = 0;
   bool wide_mode = false;
   bool mem_src_mode = false;
   bool trans_mode = false;
   int flags = 0;
   bool clip_mode = false;
   ALLEGRO_COLOR tint;

   (void)argc;
   (void)argv;

   if (!al_init()) {
      abort_example("Could not init Allegro.\n");
   }

   al_install_keyboard();
   al_init_image_addon();
   init_platform_specific();

   open_log();
   log_printf("Press 'w' to toggle wide mode.\n");
   log_printf("Press 's' to toggle memory source bitmap.\n");
   log_printf("Press space to toggle drawing to backbuffer or off-screen bitmap.\n");
   log_printf("Press 't' to toggle translucency.\n");
   log_printf("Press 'h' to toggle horizontal flipping.\n");
   log_printf("Press 'v' to toggle vertical flipping.\n");
   log_printf("Press 'c' to toggle clipping.\n");
   log_printf("\n");

   dpy = al_create_display(display_w, display_h);
   if (!dpy) {
      abort_example("Unable to set any graphic mode\n");
   }

   buf = al_create_bitmap(display_w, display_h);
   if (!buf) {
      abort_example("Unable to create buffer\n\n");
   }

   bmp = al_load_bitmap("data/mysha.pcx");
   if (!bmp) {
      abort_example("Unable to load image\n");
   }

   al_set_new_bitmap_flags(ALLEGRO_MEMORY_BITMAP);
   mem_bmp = al_load_bitmap("data/mysha.pcx");
   if (!mem_bmp) {
      abort_example("Unable to load image\n");
   }

   bmp_w = al_get_bitmap_width(bmp);
   bmp_h = al_get_bitmap_height(bmp);

   queue = al_create_event_queue();
   al_register_event_source(queue, al_get_keyboard_event_source());

   while (true) {
      if (al_get_next_event(queue, &event)) {
         if (event.type == ALLEGRO_EVENT_KEY_CHAR) {
            if (event.keyboard.keycode == ALLEGRO_KEY_ESCAPE)
               break;
            if (event.keyboard.unichar == ' ') {
               mode = !mode;
               if (mode == 0)
                  log_printf("Drawing to off-screen buffer\n");
               else
                  log_printf("Drawing to display backbuffer\n");
            }
            if (event.keyboard.unichar == 'w')
               wide_mode = !wide_mode;
            if (event.keyboard.unichar == 's') {
               mem_src_mode = !mem_src_mode;
               if (mem_src_mode)
                  log_printf("Source is memory bitmap\n");
               else
                  log_printf("Source is display bitmap\n");
            }
            if (event.keyboard.unichar == 't')
               trans_mode = !trans_mode;
            if (event.keyboard.unichar == 'h')
               flags ^= ALLEGRO_FLIP_HORIZONTAL;
            if (event.keyboard.unichar == 'v')
               flags ^= ALLEGRO_FLIP_VERTICAL;
            if (event.keyboard.unichar == 'c')
               clip_mode = !clip_mode;
         }
      }

      /*
       * mode 0 = draw scaled to off-screen buffer before
       *          blitting to display backbuffer
       * mode 1 = draw scaled to display backbuffer
       */

      if (mode == 0) {
         al_set_target_bitmap(buf);
      }
      else {
         al_set_target_backbuffer(dpy);
      }

      src_bmp = (mem_src_mode) ? mem_bmp : bmp;
      k = (wide_mode) ? 2.0 : 1.0;

      al_set_blender(ALLEGRO_ADD, ALLEGRO_ONE, ALLEGRO_ZERO);
      tint = al_map_rgba_f(1, 1, 1, 1);
      if (mode == 0)
         al_clear_to_color(al_map_rgba_f(1, 0, 0, 1));
      else
         al_clear_to_color(al_map_rgba_f(0, 0, 1, 1));

      if (trans_mode) {
         al_set_blender(ALLEGRO_ADD, ALLEGRO_ALPHA, ALLEGRO_INVERSE_ALPHA);
         tint = al_map_rgba_f(1, 1, 1, 0.5);
      }

      if (clip_mode) {
         al_set_clipping_rectangle(50, 50, display_w - 100, display_h - 100);
      }
      else {
         al_set_clipping_rectangle(0, 0, display_w, display_h);
      }

      al_draw_tinted_scaled_bitmap(src_bmp, tint,
         0, 0, bmp_w, bmp_h,
         display_w/2, display_h/2,
         k * cos(theta) * display_w/2, k * sin(theta) * display_h/2,
         flags);

      if (mode == 0) {
         al_set_target_backbuffer(dpy);
         al_set_clipping_rectangle(0, 0, display_w, display_h);
         al_set_blender(ALLEGRO_ADD, ALLEGRO_ONE, ALLEGRO_ZERO);
         al_draw_bitmap(buf, 0, 0, 0);
      }

      al_flip_display();
      al_rest(0.01);
      theta += 0.01;
   }

   al_destroy_bitmap(bmp);
   al_destroy_bitmap(mem_bmp);
   al_destroy_bitmap(buf);

   close_log(false);
   return 0;
}